

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

UEnumeration * ucnv_openAllNames_63(UErrorCode *pErrorCode)

{
  UBool UVar1;
  undefined2 *puVar2;
  uint16_t *myContext;
  UEnumeration *myEnum;
  UErrorCode *pErrorCode_local;
  
  myContext = (uint16_t *)0x0;
  UVar1 = haveAliasData(pErrorCode);
  if (UVar1 != '\0') {
    myContext = (uint16_t *)uprv_malloc_63(0x38);
    if (myContext == (uint16_t *)0x0) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      return (UEnumeration *)0x0;
    }
    memcpy(myContext,&gEnumAllConverters,0x38);
    puVar2 = (undefined2 *)uprv_malloc_63(2);
    if (puVar2 == (undefined2 *)0x0) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      uprv_free_63(myContext);
      return (UEnumeration *)0x0;
    }
    *puVar2 = 0;
    *(undefined2 **)(myContext + 4) = puVar2;
  }
  return (UEnumeration *)myContext;
}

Assistant:

U_CAPI UEnumeration * U_EXPORT2
ucnv_openAllNames(UErrorCode *pErrorCode) {
    UEnumeration *myEnum = NULL;
    if (haveAliasData(pErrorCode)) {
        uint16_t *myContext;

        myEnum = static_cast<UEnumeration *>(uprv_malloc(sizeof(UEnumeration)));
        if (myEnum == NULL) {
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        uprv_memcpy(myEnum, &gEnumAllConverters, sizeof(UEnumeration));
        myContext = static_cast<uint16_t *>(uprv_malloc(sizeof(uint16_t)));
        if (myContext == NULL) {
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
            uprv_free(myEnum);
            return NULL;
        }
        *myContext = 0;
        myEnum->context = myContext;
    }
    return myEnum;
}